

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

bool __thiscall
llm_tokenizer_bpe_session::append_bos
          (llm_tokenizer_bpe_session *this,vector<int,_std::allocator<int>_> *output)

{
  char cVar1;
  _Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_> _Var2;
  int local_c;
  
  _Var2.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl =
       (this->vocab->pimpl)._M_t.
       super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>._M_t.
       super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>.
       super__Head_base<0UL,_llama_vocab::impl_*,_false>;
  cVar1 = *(char *)((long)_Var2.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl +
                   0x4d);
  if (cVar1 == '\x01') {
    local_c = *(int *)((long)_Var2.super__Head_base<0UL,_llama_vocab::impl_*,_false>._M_head_impl +
                      0x10);
    if (local_c == -1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
                 ,0x1ba,"GGML_ASSERT(%s) failed","vocab.token_bos() != LLAMA_TOKEN_NULL");
    }
    llama_vocab::std::vector<int,_std::allocator<int>_>::emplace_back<int>(output,&local_c);
  }
  return (bool)cVar1;
}

Assistant:

bool append_bos(std::vector<llama_token> & output) const {
        if (vocab.get_add_bos()) {
            GGML_ASSERT(vocab.token_bos() != LLAMA_TOKEN_NULL);
            output.push_back(vocab.token_bos());
            return true;
        }
        return false;
    }